

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O3

bool __thiscall asmjit::StringBuilder::eq(StringBuilder *this,char *str,size_t len)

{
  size_t sVar1;
  int iVar2;
  size_t sVar3;
  bool bVar4;
  
  sVar1 = this->_length;
  if (len == 0xffffffffffffffff) {
    if (sVar1 != 0) {
      sVar3 = 0;
      do {
        if (this->_data[sVar3] != str[sVar3]) {
          return false;
        }
        if (str[sVar3] == '\0') {
          return false;
        }
        sVar3 = sVar3 + 1;
      } while (sVar1 != sVar3);
    }
    bVar4 = str[sVar1] == '\0';
  }
  else if (sVar1 == len) {
    iVar2 = bcmp(this->_data,str,len);
    bVar4 = iVar2 == 0;
  }
  else {
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool StringBuilder::eq(const char* str, size_t len) const noexcept {
  const char* aData = _data;
  const char* bData = str;

  size_t aLength = _length;
  size_t bLength = len;

  if (bLength == Globals::kInvalidIndex) {
    size_t i;
    for (i = 0; i < aLength; i++)
      if (aData[i] != bData[i] || bData[i] == 0)
        return false;
    return bData[i] == 0;
  }
  else {
    if (aLength != bLength)
      return false;
    return ::memcmp(aData, bData, aLength) == 0;
  }
}